

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeSetHasContent(BtShared *pBt,Pgno pgno)

{
  u32 uVar1;
  Bitvec *pBVar2;
  u32 in_ESI;
  long in_RDI;
  u32 unaff_retaddr;
  int rc;
  int local_10;
  
  local_10 = 0;
  if (*(long *)(in_RDI + 0x58) == 0) {
    pBVar2 = sqlite3BitvecCreate(in_ESI);
    *(Bitvec **)(in_RDI + 0x58) = pBVar2;
    if (*(long *)(in_RDI + 0x58) == 0) {
      local_10 = 7;
    }
  }
  if ((local_10 == 0) && (uVar1 = sqlite3BitvecSize(*(Bitvec **)(in_RDI + 0x58)), in_ESI <= uVar1))
  {
    local_10 = sqlite3BitvecSet((Bitvec *)CONCAT44(pgno,rc),unaff_retaddr);
  }
  return local_10;
}

Assistant:

static int btreeSetHasContent(BtShared *pBt, Pgno pgno){
  int rc = SQLITE_OK;
  if( !pBt->pHasContent ){
    assert( pgno<=pBt->nPage );
    pBt->pHasContent = sqlite3BitvecCreate(pBt->nPage);
    if( !pBt->pHasContent ){
      rc = SQLITE_NOMEM_BKPT;
    }
  }
  if( rc==SQLITE_OK && pgno<=sqlite3BitvecSize(pBt->pHasContent) ){
    rc = sqlite3BitvecSet(pBt->pHasContent, pgno);
  }
  return rc;
}